

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O1

int lsaveproto(lua_State *L)

{
  int iVar1;
  sproto *psVar2;
  ulong uVar3;
  
  psVar2 = (sproto *)lua_touserdata(L,1);
  uVar3 = luaL_optinteger(L,2,0);
  if (0xf < (uint)uVar3) {
    iVar1 = luaL_error(L,"Invalid global slot index %d",uVar3 & 0xffffffff);
    return iVar1;
  }
  G_sproto[(uint)uVar3 & 0xf] = psVar2;
  return 0;
}

Assistant:

static int
lsaveproto(lua_State *L) {
	struct sproto * sp = lua_touserdata(L, 1);
	int index = luaL_optinteger(L, 2, 0);
	if (index < 0 || index >= MAX_GLOBALSPROTO) {
		return luaL_error(L, "Invalid global slot index %d", index);
	}
	/* TODO : release old object (memory leak now, but thread safe)*/
	G_sproto[index] = sp;
	return 0;
}